

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_visuals(char *title,wchar_t row)

{
  menu *pmVar1;
  
  screen_save();
  clear_from(L'\0');
  if (visual_menu == (menu *)0x0) {
    pmVar1 = menu_new_action(visual_menu_items,6);
    visual_menu = pmVar1;
    pmVar1->title = title;
    pmVar1->selections = "abcdefghijklmnopqrstuvwxyz";
    pmVar1->browse_hook = visuals_browse_hook;
    pmVar1->header = "To edit visuals, use the knowledge menu";
  }
  menu_layout(visual_menu,&SCREEN_REGION);
  menu_select(visual_menu,0,false);
  screen_load();
  return;
}

Assistant:

static void do_cmd_visuals(const char *title, int row)
{
	screen_save();
	clear_from(0);

	if (!visual_menu)
	{
		visual_menu = menu_new_action(visual_menu_items,
				N_ELEMENTS(visual_menu_items));

		visual_menu->title = title;
		visual_menu->selections = lower_case;
		visual_menu->browse_hook = visuals_browse_hook;
		visual_menu->header = "To edit visuals, use the knowledge menu";
	}

	menu_layout(visual_menu, &SCREEN_REGION);
	menu_select(visual_menu, 0, false);

	screen_load();
}